

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O3

void background_thread0_work(tsd_t *tsd)

{
  malloc_mutex_t *mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int8_t *piVar3;
  bool bVar4;
  long lVar5;
  background_thread_info_t *thread;
  _Bool _Var6;
  uint uVar7;
  int iVar8;
  pthread_attr_t *ppVar9;
  ulong uVar10;
  background_thread_info_t *pbVar11;
  _func_void_ptr_void_ptr *extraout_RDX;
  _func_void_ptr_void_ptr *extraout_RDX_00;
  _func_void_ptr_void_ptr *start_routine;
  pthread_mutex_t *ppVar12;
  char *pcVar13;
  pthread_attr_t *ppVar14;
  pthread_attr_t *ppVar15;
  undefined8 uStack_70;
  char acStack_68 [8];
  pthread_mutex_t *local_60;
  background_thread_state_t local_54;
  pthread_attr_t *local_50;
  char *local_48;
  pthread_attr_t *local_40;
  background_thread_info_t *local_38;
  
  lVar5 = -(duckdb_je_max_background_threads + 0xf & 0xfffffffffffffff0);
  pcVar13 = acStack_68 + lVar5;
  if (1 < duckdb_je_max_background_threads) {
    uVar10 = 1;
    uVar7 = 2;
    do {
      pcVar13[uVar10] = '\0';
      uVar10 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar10 < duckdb_je_max_background_threads);
  }
  local_40 = (pthread_attr_t *)duckdb_je_max_background_threads;
  if (duckdb_je_background_thread_info->state != background_thread_stopped) {
    local_48 = (char *)CONCAT44(local_48._4_4_,1);
LAB_0115d8e4:
    uVar10 = (ulong)local_48 & 0xffffffff;
    do {
      *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115d8f0;
      _Var6 = background_thread_pause_check((tsdn_t *)tsd,duckdb_je_background_thread_info);
      pbVar11 = duckdb_je_background_thread_info;
      if (!_Var6) {
        if (duckdb_je_n_background_threads != uVar10) {
          (duckdb_je_background_thread_info->mtx).field_0.field_0.locked.repr = false;
          *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115d92a;
          pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar11->mtx).field_0 + 0x48));
          if ((pthread_attr_t *)&DAT_00000001 < local_40) {
            ppVar9 = (pthread_attr_t *)&DAT_00000001;
            ppVar14 = (pthread_attr_t *)0x2;
            do {
              if (ppVar9->__size[(long)pcVar13] == '\0') {
                local_38 = duckdb_je_background_thread_info + (long)ppVar9;
                ppVar12 = (pthread_mutex_t *)
                          ((long)&duckdb_je_background_thread_info[(long)ppVar9].mtx.field_0 + 0x48)
                ;
                local_60 = ppVar12;
                local_50 = ppVar9;
                *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115d97c;
                iVar8 = pthread_mutex_trylock(ppVar12);
                if (iVar8 != 0) {
                  mutex = &local_38->mtx;
                  *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115d991;
                  duckdb_je_malloc_mutex_lock_slow(mutex);
                  (local_38->mtx).field_0.field_0.locked.repr = true;
                }
                pbVar11 = local_38;
                ppVar12 = local_60;
                puVar1 = &(local_38->mtx).field_0.field_0.prof_data.n_lock_ops;
                *puVar1 = *puVar1 + 1;
                if (&((local_38->mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
                  (local_38->mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
                  ppwVar2 = &(local_38->mtx).field_0.witness.link.qre_prev;
                  *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
                }
                local_54 = local_38->state;
                (local_38->mtx).field_0.field_0.locked.repr = false;
                *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115d9c1;
                pthread_mutex_unlock(ppVar12);
                thread = local_38;
                if (local_54 == background_thread_started) {
                  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
                       tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level +
                       '\x01';
                  start_routine = extraout_RDX;
                  if ((tsd->state).repr == '\0') {
                    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115da0f;
                    duckdb_je_tsd_slow_update(tsd);
                    start_routine = extraout_RDX_00;
                  }
                  ppVar9 = local_50;
                  *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115da1b;
                  uVar7 = background_thread_create_signals_masked
                                    (&thread->thread,ppVar9,start_routine,pbVar11);
                  piVar3 = &tsd->
                            cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
                  *piVar3 = *piVar3 + -1;
                  if (*piVar3 == '\0') {
                    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115da32;
                    duckdb_je_tsd_slow_update(tsd);
                  }
                  if (uVar7 == 0) {
                    local_48 = (char *)CONCAT44(local_48._4_4_,(int)local_48 + 1);
                    local_50->__size[(long)pcVar13] = '\x01';
                  }
                  else {
                    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115da48;
                    duckdb_je_malloc_printf
                              ("<jemalloc>: background thread creation failed (%d)\n",(ulong)uVar7);
                    if (duckdb_je_opt_abort == true) {
                      *(code **)((long)&uStack_70 + lVar5) = background_thread_pause_check;
                      abort();
                    }
                  }
                  *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115da75;
                  malloc_mutex_lock((tsdn_t *)tsd,&duckdb_je_background_thread_info->mtx);
                  if (duckdb_je_background_thread_info->state != background_thread_stopped)
                  goto LAB_0115d8e4;
                  goto LAB_0115da86;
                }
              }
              bVar4 = ppVar14 < local_40;
              ppVar9 = ppVar14;
              ppVar14 = (pthread_attr_t *)(ulong)((int)ppVar14 + 1);
            } while (bVar4);
          }
          *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115d9f2;
          malloc_mutex_lock((tsdn_t *)tsd,&duckdb_je_background_thread_info->mtx);
        }
        *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115d907;
        background_work_sleep_once((tsdn_t *)tsd,duckdb_je_background_thread_info,0);
      }
    } while (duckdb_je_background_thread_info->state != background_thread_stopped);
  }
LAB_0115da86:
  if ((pthread_attr_t *)&DAT_00000001 < local_40) {
    ppVar9 = (pthread_attr_t *)&DAT_00000001;
    ppVar14 = (pthread_attr_t *)0x2;
    ppVar15 = local_40;
    local_48 = pcVar13;
    do {
      pbVar11 = duckdb_je_background_thread_info + (long)ppVar9;
      if (ppVar9->__size[(long)local_48] == '\x01') {
        *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115dac6;
        background_threads_disable_single(tsd,pbVar11);
      }
      else {
        ppVar12 = (pthread_mutex_t *)((long)&(pbVar11->mtx).field_0 + 0x48);
        *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115dad7;
        iVar8 = pthread_mutex_trylock(ppVar12);
        if (iVar8 != 0) {
          *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115dae4;
          duckdb_je_malloc_mutex_lock_slow(&pbVar11->mtx);
          (pbVar11->mtx).field_0.field_0.locked.repr = true;
        }
        puVar1 = &(pbVar11->mtx).field_0.field_0.prof_data.n_lock_ops;
        *puVar1 = *puVar1 + 1;
        if (&((pbVar11->mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
          (pbVar11->mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
          ppwVar2 = &(pbVar11->mtx).field_0.witness.link.qre_prev;
          *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
        }
        if (pbVar11->state != background_thread_stopped) {
          duckdb_je_n_background_threads = duckdb_je_n_background_threads - 1;
          pbVar11->state = background_thread_stopped;
        }
        (pbVar11->mtx).field_0.field_0.locked.repr = false;
        *(undefined8 *)((long)&uStack_70 + lVar5) = 0x115db27;
        pthread_mutex_unlock(ppVar12);
        ppVar15 = local_40;
      }
      bVar4 = ppVar14 < ppVar15;
      ppVar9 = ppVar14;
      ppVar14 = (pthread_attr_t *)(ulong)((int)ppVar14 + 1);
    } while (bVar4);
  }
  duckdb_je_background_thread_info->state = background_thread_stopped;
  return;
}

Assistant:

static void
background_thread0_work(tsd_t *tsd) {
	/*
	 * Thread0 is also responsible for launching / terminating threads.
	 * We are guaranteed that `max_background_threads` will not change
	 * underneath us. Unfortunately static analysis tools do not understand
	 * this, so we are extracting `max_background_threads` into a local
	 * variable solely for the sake of exposing this information to such
	 * tools.
	 */
	const size_t const_max_background_threads = max_background_threads;
	assert(const_max_background_threads > 0);
	VARIABLE_ARRAY(bool, created_threads, const_max_background_threads);
	unsigned i;
	for (i = 1; i < const_max_background_threads; i++) {
		created_threads[i] = false;
	}
	/* Start working, and create more threads when asked. */
	unsigned n_created = 1;
	while (background_thread_info[0].state != background_thread_stopped) {
		if (background_thread_pause_check(tsd_tsdn(tsd),
		    &background_thread_info[0])) {
			continue;
		}
		if (check_background_thread_creation(tsd, const_max_background_threads,
		    &n_created, (bool *)&created_threads)) {
			continue;
		}
		background_work_sleep_once(tsd_tsdn(tsd),
		    &background_thread_info[0], 0);
	}

	/*
	 * Shut down other threads at exit.  Note that the ctl thread is holding
	 * the global background_thread mutex (and is waiting) for us.
	 */
	assert(!background_thread_enabled());
	for (i = 1; i < const_max_background_threads; i++) {
		background_thread_info_t *info = &background_thread_info[i];
		assert(info->state != background_thread_paused);
		if (created_threads[i]) {
			background_threads_disable_single(tsd, info);
		} else {
			malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
			if (info->state != background_thread_stopped) {
				/* The thread was not created. */
				assert(info->state ==
				    background_thread_started);
				n_background_threads--;
				info->state = background_thread_stopped;
			}
			malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
		}
	}
	background_thread_info[0].state = background_thread_stopped;
	assert(n_background_threads == 1);
}